

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_proxy.cpp
# Opt level: O2

void __thiscall
ot::commissioner::ProxyClient::FetchMeshLocalPrefix(ProxyClient *this,ErrorHandler *aHandler)

{
  CommissionerImpl *pCVar1;
  __0 *this_00;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  anon_class_40_2_1bbb15e4 onResponse;
  
  onResponse.this = this;
  std::function<void_(ot::commissioner::Error)>::function(&onResponse.aHandler,aHandler);
  pCVar1 = this->mCommissioner;
  local_58 = (code *)0x0;
  pcStack_50 = (code *)0x0;
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  this_00 = (__0 *)operator_new(0x28);
  FetchMeshLocalPrefix(std::function<void(ot::commissioner::Error)>)::$_0::__0(this_00,&onResponse);
  pcStack_50 = std::
               _Function_handler<void_(const_ot::commissioner::ActiveOperationalDataset_*,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/udp_proxy.cpp:189:23)>
               ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(const_ot::commissioner::ActiveOperationalDataset_*,_ot::commissioner::Error),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/udp_proxy.cpp:189:23)>
             ::_M_manager;
  local_68._M_unused._0_8_ = (undefined8)this_00;
  (*(pCVar1->super_Commissioner)._vptr_Commissioner[0x19])(pCVar1,&local_68,0x800);
  std::_Function_base::~_Function_base((_Function_base *)&local_68);
  std::_Function_base::~_Function_base(&onResponse.aHandler.super__Function_base);
  return;
}

Assistant:

void ProxyClient::FetchMeshLocalPrefix(Commissioner::ErrorHandler aHandler)
{
    auto onResponse = [=](const ActiveOperationalDataset *aActiveDataset, Error aError) {
        Error error;

        SuccessOrExit(error = aError);
        ASSERT(aActiveDataset != nullptr);

        VerifyOrExit(aActiveDataset->mPresentFlags & ActiveOperationalDataset::kMeshLocalPrefixBit,
                     error = ERROR_BAD_FORMAT("Mesh-Local prefix not included in response"));
        SuccessOrExit(error = SetMeshLocalPrefix(aActiveDataset->mMeshLocalPrefix));

    exit:
        aHandler(aError);
    };

    mCommissioner.GetActiveDataset(onResponse, ActiveOperationalDataset::kMeshLocalPrefixBit);
}